

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg_tobin.c
# Opt level: O2

int cfg_tobin_stringlist(void *reference,size_t bin_size,const_strarray *value)

{
  int iVar1;
  
  if (bin_size != 0x10) {
    return -1;
  }
  if (*value->value != '\0') {
    iVar1 = strarray_copy((strarray *)reference,(strarray *)value);
    return iVar1;
  }
  *(undefined8 *)reference = 0;
  *(undefined8 *)((long)reference + 8) = 0;
  return 0;
}

Assistant:

int
cfg_tobin_stringlist(void *reference, size_t bin_size, const struct const_strarray *value) {
  struct strarray *array;

  if (bin_size != sizeof(*array)) {
    return -1;
  }

  array = (struct strarray *)reference;

  if (!value->value[0]) {
    strarray_init(array);
    return 0;
  }
  return strarray_copy_c(array, value);
}